

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::MultiTransformNode::resetInDegree(MultiTransformNode *this)

{
  size_type sVar1;
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x58) = 0;
  if (*(long *)(in_RDI + 0x50) == 1) {
    (**(code **)(**(long **)(in_RDI + 0x80) + 0x40))();
    sVar1 = std::
            vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
            ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                    *)(in_RDI + 0x68));
    if (1 < sVar1) {
      (**(code **)(**(long **)(in_RDI + 0x80) + 0x40))();
    }
  }
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + -1;
  return;
}

Assistant:

void SceneGraph::MultiTransformNode::resetInDegree()
  {
    closed = false;
    if (indegree == 1) {
      child->resetInDegree();
      if (spaces.size() > 1) child->resetInDegree(); // break instance up when motion blur is used
    }
    indegree--;
  }